

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_parse_key_sec1_der(mbedtls_ecp_keypair *eck,uchar *key,size_t keylen)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  uchar *end2;
  uchar *end;
  uchar *p;
  mbedtls_asn1_buf params;
  size_t len;
  int local_30;
  int pubkey_done;
  int version;
  int ret;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_ecp_keypair *eck_local;
  
  end = key;
  _version = keylen;
  keylen_local = (size_t)key;
  key_local = (uchar *)eck;
  pubkey_done = mbedtls_asn1_get_tag(&end,key + keylen,(size_t *)&params.p,0x30);
  if (pubkey_done == 0) {
    puVar3 = end + (long)params.p;
    pubkey_done = mbedtls_asn1_get_int(&end,puVar3,&local_30);
    if (pubkey_done == 0) {
      if (local_30 == 1) {
        pubkey_done = mbedtls_asn1_get_tag(&end,puVar3,(size_t *)&params.p,4);
        if (pubkey_done == 0) {
          pubkey_done = mbedtls_mpi_read_binary
                                  ((mbedtls_mpi *)(key_local + 0xf8),end,(size_t)params.p);
          if (pubkey_done == 0) {
            end = params.p + (long)end;
            bVar1 = false;
            iVar2 = 0;
            if (end != puVar3) {
              pubkey_done = mbedtls_asn1_get_tag(&end,puVar3,(size_t *)&params.p,0xa0);
              if (pubkey_done == 0) {
                pubkey_done = pk_get_ecparams(&end,end + (long)params.p,(mbedtls_asn1_buf *)&p);
                if ((pubkey_done != 0) ||
                   (pubkey_done = pk_use_ecparams((mbedtls_asn1_buf *)&p,
                                                  (mbedtls_ecp_group *)key_local), pubkey_done != 0)
                   ) {
                  mbedtls_ecp_keypair_free((mbedtls_ecp_keypair *)key_local);
                  return pubkey_done;
                }
                pubkey_done = 0;
              }
              else {
                if (pubkey_done != -0x62) {
                  mbedtls_ecp_keypair_free((mbedtls_ecp_keypair *)key_local);
                  return pubkey_done + -0x3d00;
                }
                pubkey_done = -0x62;
              }
              pubkey_done = mbedtls_asn1_get_tag(&end,puVar3,(size_t *)&params.p,0xa1);
              if (pubkey_done == 0) {
                puVar3 = end + (long)params.p;
                pubkey_done = mbedtls_asn1_get_bitstring_null(&end,puVar3,(size_t *)&params.p);
                if (pubkey_done != 0) {
                  return pubkey_done + -0x3d00;
                }
                if (end + (long)params.p != puVar3) {
                  return -0x3d66;
                }
                iVar2 = pk_get_ecpubkey(&end,puVar3,(mbedtls_ecp_keypair *)key_local);
                if (iVar2 == 0) {
                  bVar1 = true;
                }
                else if (iVar2 != -0x4e80) {
                  return -0x3d00;
                }
              }
              else {
                if (pubkey_done != -0x62) {
                  mbedtls_ecp_keypair_free((mbedtls_ecp_keypair *)key_local);
                  return pubkey_done + -0x3d00;
                }
                iVar2 = -0x62;
              }
            }
            pubkey_done = iVar2;
            if ((bVar1) ||
               (pubkey_done = mbedtls_ecp_mul((mbedtls_ecp_group *)key_local,
                                              (mbedtls_ecp_point *)(key_local + 0x110),
                                              (mbedtls_mpi *)(key_local + 0xf8),
                                              (mbedtls_ecp_point *)(key_local + 0x50),
                                              (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0
                                             ), pubkey_done == 0)) {
              pubkey_done = mbedtls_ecp_check_privkey
                                      ((mbedtls_ecp_group *)key_local,
                                       (mbedtls_mpi *)(key_local + 0xf8));
              if (pubkey_done == 0) {
                eck_local._4_4_ = 0;
              }
              else {
                mbedtls_ecp_keypair_free((mbedtls_ecp_keypair *)key_local);
                eck_local._4_4_ = pubkey_done;
              }
            }
            else {
              mbedtls_ecp_keypair_free((mbedtls_ecp_keypair *)key_local);
              eck_local._4_4_ = pubkey_done + -0x3d00;
            }
          }
          else {
            mbedtls_ecp_keypair_free((mbedtls_ecp_keypair *)key_local);
            eck_local._4_4_ = pubkey_done + -0x3d00;
          }
        }
        else {
          eck_local._4_4_ = pubkey_done + -0x3d00;
        }
      }
      else {
        eck_local._4_4_ = -0x3d80;
      }
    }
    else {
      eck_local._4_4_ = pubkey_done + -0x3d00;
    }
  }
  else {
    eck_local._4_4_ = pubkey_done + -0x3d00;
  }
  return eck_local._4_4_;
}

Assistant:

static int pk_parse_key_sec1_der( mbedtls_ecp_keypair *eck,
                                  const unsigned char *key,
                                  size_t keylen )
{
    int ret;
    int version, pubkey_done;
    size_t len;
    mbedtls_asn1_buf params;
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = p + keylen;
    unsigned char *end2;

    /*
     * RFC 5915, or SEC1 Appendix C.4
     *
     * ECPrivateKey ::= SEQUENCE {
     *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
     *      privateKey     OCTET STRING,
     *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
     *      publicKey  [1] BIT STRING OPTIONAL
     *    }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, &version ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( version != 1 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_VERSION );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ( ret = mbedtls_mpi_read_binary( &eck->d, p, len ) ) != 0 )
    {
        mbedtls_ecp_keypair_free( eck );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    p += len;

    pubkey_done = 0;
    if( p != end )
    {
        /*
         * Is 'parameters' present?
         */
        if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) ) == 0 )
        {
            if( ( ret = pk_get_ecparams( &p, p + len, &params) ) != 0 ||
                ( ret = pk_use_ecparams( &params, &eck->grp )  ) != 0 )
            {
                mbedtls_ecp_keypair_free( eck );
                return( ret );
            }
        }
        else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        {
            mbedtls_ecp_keypair_free( eck );
            return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
        }

        /*
         * Is 'publickey' present? If not, or if we can't read it (eg because it
         * is compressed), create it from the private key.
         */
        if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) ) == 0 )
        {
            end2 = p + len;

            if( ( ret = mbedtls_asn1_get_bitstring_null( &p, end2, &len ) ) != 0 )
                return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

            if( p + len != end2 )
                return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
                        MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

            if( ( ret = pk_get_ecpubkey( &p, end2, eck ) ) == 0 )
                pubkey_done = 1;
            else
            {
                /*
                 * The only acceptable failure mode of pk_get_ecpubkey() above
                 * is if the point format is not recognized.
                 */
                if( ret != MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE )
                    return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
            }
        }
        else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        {
            mbedtls_ecp_keypair_free( eck );
            return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
        }
    }

    if( ! pubkey_done &&
        ( ret = mbedtls_ecp_mul( &eck->grp, &eck->Q, &eck->d, &eck->grp.G,
                                                      NULL, NULL ) ) != 0 )
    {
        mbedtls_ecp_keypair_free( eck );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_ecp_check_privkey( &eck->grp, &eck->d ) ) != 0 )
    {
        mbedtls_ecp_keypair_free( eck );
        return( ret );
    }

    return( 0 );
}